

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_equation_units.cpp
# Opt level: O1

void __thiscall fujita_fujitaTests_Test::TestBody(fujita_fujitaTests_Test *this)

{
  ParamType *pPVar1;
  precise_unit *result;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  result_00;
  _Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  extraout_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_00;
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  extraout_RDX_01;
  pointer *__ptr;
  char *message;
  char *pcVar2;
  double val;
  double __x;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  expr1;
  AssertionResult AVar3;
  AssertionResult gtest_ar;
  AssertHelper local_40;
  internal local_38 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffd0;
  
  pPVar1 = testing::WithParamInterface<std::pair<double,_float>_>::GetParam();
  pcVar2 = (char *)pPVar1->first;
  val = (double)pPVar1->second;
  __x = units::convert<units::precise_unit,units::precise_unit>
                  ((units *)units::precise::mph,val,(precise_unit *)units::precise::special::fujita,
                   result);
  expr1._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)round(__x);
  local_40.data_ = (AssertHelperData *)floor((double)pcVar2);
  AVar3 = testing::internal::CmpHelperEQ<double,double>
                    (local_38,"std::round(conv)","std::floor(fnumber)",
                     (double *)&stack0xffffffffffffffb8,(double *)&local_40);
  result_00._M_head_impl =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       AVar3.message_._M_t.
       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
       ._M_head_impl;
  if (local_38[0] == (internal)0x0) {
    testing::Message::Message((Message *)&stack0xffffffffffffffb8);
    if (in_stack_ffffffffffffffd0 ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = (in_stack_ffffffffffffffd0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_equation_units.cpp"
               ,0x1e1,message);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&stack0xffffffffffffffb8);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    result_00 = extraout_RDX.
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl;
    if (expr1._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)expr1._M_head_impl + 8))();
      result_00._M_head_impl = extraout_RDX_00;
    }
  }
  if (in_stack_ffffffffffffffd0 !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xffffffffffffffd0,in_stack_ffffffffffffffd0);
    result_00._M_head_impl =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         extraout_RDX_01.
         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         .
         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         ._M_head_impl;
  }
  units::convert<units::precise_unit,units::precise_unit>
            ((units *)units::precise::special::fujita,__x,(precise_unit *)units::precise::mph,
             (precise_unit *)result_00._M_head_impl);
  testing::internal::DoubleNearPredFormat
            ((char *)expr1._M_head_impl,(char *)0x13639a,pcVar2,val,__x,
             (double)in_stack_ffffffffffffffd0);
  if (local_38[0] == (internal)0x0) {
    testing::Message::Message((Message *)&stack0xffffffffffffffb8);
    if (in_stack_ffffffffffffffd0 ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (in_stack_ffffffffffffffd0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_equation_units.cpp"
               ,0x1e3,pcVar2);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&stack0xffffffffffffffb8);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if ((tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )expr1._M_head_impl !=
        (_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )0x0) {
      (**(code **)(*(long *)expr1._M_head_impl + 8))();
    }
  }
  if (in_stack_ffffffffffffffd0 !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xffffffffffffffd0,in_stack_ffffffffffffffd0);
  }
  return;
}

Assistant:

TEST_P(fujita, fujitaTests)
{
    auto p = GetParam();
    auto fnumber = p.first;
    auto wspeed = static_cast<double>(p.second);

    auto conv = convert(wspeed, precise::mph, precise::special::fujita);

    EXPECT_EQ(std::round(conv), std::floor(fnumber));
    EXPECT_NEAR(
        convert(conv, precise::special::fujita, precise::mph), wspeed, 0.5);
}